

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

string * __thiscall
cmOutputConverter::Shell__GetArgument_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,char *in,int flags)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  cmStateSnapshot *pcVar4;
  string *psVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  cmOutputConverter *pcVar9;
  ulong uVar10;
  uint flags_00;
  char *pcVar11;
  bool bVar12;
  ostringstream out;
  byte local_1ca;
  byte local_1c9;
  int local_1c8;
  uint local_1c4;
  string *local_1c0;
  char *local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [376];
  
  bVar3 = (byte)in;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  flags_00 = (uint)in;
  iVar7 = Shell__ArgumentNeedsQuotes((char *)this,flags_00);
  if (iVar7 != 0) {
    if ((char)bVar3 < '\0') {
      if ((flags_00 >> 8 & 1) != 0) {
        local_1ca = 0x22;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1ca,1);
      }
      local_1ca = 0x27;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1ca,1);
    }
    else {
      local_1ca = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1ca,1);
    }
  }
  local_1c8 = iVar7;
  local_1c0 = __return_storage_ptr__;
  if (*(char *)&(this->StateSnapshot).State == '\0') {
    iVar7 = 0;
  }
  else {
    local_1c4 = flags_00 & 9;
    local_1c9 = ((ulong)in & 0x30) != 0 & bVar3 | (byte)((flags_00 & 2) >> 1);
    local_1b8 = "$$";
    if (((ulong)in & 1) == 0) {
      local_1b8 = "\"$\"";
    }
    local_1b0 = (ulong)(flags_00 & 1) ^ 3;
    iVar7 = 0;
    do {
      if (((ulong)in & 0x40) != 0) {
        pcVar9 = (cmOutputConverter *)Shell__SkipMakeVariables((char *)this);
        if (pcVar9 == this) {
          bVar12 = true;
        }
        else {
          do {
            local_1ca = *(byte *)&(this->StateSnapshot).State;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)&local_1ca,1);
            this = (cmOutputConverter *)((long)&(this->StateSnapshot).State + 1);
          } while (this != pcVar9);
          bVar12 = *(char *)&(this->StateSnapshot).State != '\0';
          iVar7 = 0;
        }
        if (!bVar12) break;
      }
      iVar6 = iVar7;
      if ((flags_00 >> 8 & 1) == 0) {
        if (((ulong)in & 4) == 0) {
          cVar1 = *(char *)&(this->StateSnapshot).State;
          if (cVar1 == '\\') {
            iVar6 = iVar7 + 1;
          }
          else {
            iVar6 = 0;
            if (cVar1 == '\"') {
              if (0 < iVar7) {
                iVar7 = iVar7 + 1;
                do {
                  local_1ca = 0x5c;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)&local_1ca,1);
                  iVar7 = iVar7 + -1;
                } while (1 < iVar7);
                iVar7 = 0;
              }
              local_1ca = 0x5c;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)&local_1ca,1);
              iVar6 = iVar7;
            }
          }
        }
      }
      else {
        uVar8 = *(byte *)&(this->StateSnapshot).State - 0x22;
        if ((uVar8 < 0x3f) && ((0x4400000000000005U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) {
          local_1ca = 0x5c;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1ca,1);
        }
      }
      iVar7 = iVar6;
      bVar2 = *(byte *)&(this->StateSnapshot).State;
      if (bVar2 < 0x25) {
        if (bVar2 == 0x23) {
          uVar10 = 2;
          pcVar11 = "$#";
          if (local_1c4 == 9) {
LAB_003fb3ff:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,uVar10);
          }
          else {
            local_1ca = 0x23;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)&local_1ca,1);
          }
        }
        else if (bVar2 == 0x24) {
          uVar10 = local_1b0;
          pcVar11 = local_1b8;
          if (((ulong)in & 3) != 0) goto LAB_003fb3ff;
          local_1ca = 0x24;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1ca,1);
        }
        else {
LAB_003fb3ac:
          local_1ca = bVar2;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1ca,1);
        }
      }
      else if (bVar2 == 0x25) {
        uVar10 = 2;
        pcVar11 = "%%";
        if (local_1c9 != 0) goto LAB_003fb3ff;
        local_1ca = 0x25;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1ca,1);
      }
      else {
        if (bVar2 != 0x3b) goto LAB_003fb3ac;
        uVar10 = 3;
        pcVar11 = "\";\"";
        if (((ulong)in & 2) != 0) goto LAB_003fb3ff;
        local_1ca = 0x3b;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1ca,1);
      }
      pcVar4 = &this->StateSnapshot;
      this = (cmOutputConverter *)((long)&(this->StateSnapshot).State + 1);
    } while (*(char *)((long)&pcVar4->State + 1) != '\0');
  }
  psVar5 = local_1c0;
  if (local_1c8 != 0) {
    if (0 < iVar7) {
      iVar7 = iVar7 + 1;
      do {
        local_1ca = 0x5c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1ca,1);
        iVar7 = iVar7 + -1;
      } while (1 < iVar7);
    }
    if ((char)bVar3 < '\0') {
      local_1ca = 0x27;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1ca,1);
      if ((flags_00 >> 8 & 1) != 0) {
        local_1ca = 0x22;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1ca,1);
      }
    }
    else {
      local_1ca = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1ca,1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar5;
}

Assistant:

std::string cmOutputConverter::Shell__GetArgument(const char* in, int flags)
{
  std::ostringstream out;

  /* String iterator.  */
  const char* c;

  /* Keep track of how many backslashes have been encountered in a row.  */
  int windows_backslashes = 0;

  /* Whether the argument must be quoted.  */
  int needQuotes = Shell__ArgumentNeedsQuotes(in, flags);
  if (needQuotes) {
    /* Add the opening quote for this argument.  */
    if (flags & Shell_Flag_WatcomQuote) {
      if (flags & Shell_Flag_IsUnix) {
        out << '"';
      }
      out << '\'';
    } else {
      out << '"';
    }
  }

  /* Scan the string for characters that require escaping or quoting.  */
  for (c = in; *c; ++c) {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if (flags & Shell_Flag_AllowMakeVariables) {
      const char* skip = Shell__SkipMakeVariables(c);
      if (skip != c) {
        /* Copy to the end of the make variable references.  */
        while (c != skip) {
          out << *c++;
        }

        /* The make variable reference eliminates any escaping needed
           for preceding backslashes.  */
        windows_backslashes = 0;

        /* Stop if we have reached the end of the string.  */
        if (!*c) {
          break;
        }
      }
    }

    /* Check whether this character needs escaping for the shell.  */
    if (flags & Shell_Flag_IsUnix) {
      /* On Unix a few special characters need escaping even inside a
         quoted argument.  */
      if (*c == '\\' || *c == '"' || *c == '`' || *c == '$') {
        /* This character needs a backslash to escape it.  */
        out << '\\';
      }
    } else if (flags & Shell_Flag_EchoWindows) {
      /* On Windows the built-in command shell echo never needs escaping.  */
    } else {
      /* On Windows only backslashes and double-quotes need escaping.  */
      if (*c == '\\') {
        /* Found a backslash.  It may need to be escaped later.  */
        ++windows_backslashes;
      } else if (*c == '"') {
        /* Found a double-quote.  Escape all immediately preceding
           backslashes.  */
        while (windows_backslashes > 0) {
          --windows_backslashes;
          out << '\\';
        }

        /* Add the backslash to escape the double-quote.  */
        out << '\\';
      } else {
        /* We encountered a normal character.  This eliminates any
           escaping needed for preceding backslashes.  */
        windows_backslashes = 0;
      }
    }

    /* Check whether this character needs escaping for a make tool.  */
    if (*c == '$') {
      if (flags & Shell_Flag_Make) {
        /* In Makefiles a dollar is written $$.  The make tool will
           replace it with just $ before passing it to the shell.  */
        out << "$$";
      } else if (flags & Shell_Flag_VSIDE) {
        /* In a VS IDE a dollar is written "$".  If this is written in
           an un-quoted argument it starts a quoted segment, inserts
           the $ and ends the segment.  If it is written in a quoted
           argument it ends quoting, inserts the $ and restarts
           quoting.  Either way the $ is isolated from surrounding
           text to avoid looking like a variable reference.  */
        out << "\"$\"";
      } else {
        /* Otherwise a dollar is written just $. */
        out << '$';
      }
    } else if (*c == '#') {
      if ((flags & Shell_Flag_Make) && (flags & Shell_Flag_WatcomWMake)) {
        /* In Watcom WMake makefiles a pound is written $#.  The make
           tool will replace it with just # before passing it to the
           shell.  */
        out << "$#";
      } else {
        /* Otherwise a pound is written just #. */
        out << '#';
      }
    } else if (*c == '%') {
      if ((flags & Shell_Flag_VSIDE) ||
          ((flags & Shell_Flag_Make) &&
           ((flags & Shell_Flag_MinGWMake) || (flags & Shell_Flag_NMake)))) {
        /* In the VS IDE, NMake, or MinGW make a percent is written %%.  */
        out << "%%";
      } else {
        /* Otherwise a percent is written just %. */
        out << '%';
      }
    } else if (*c == ';') {
      if (flags & Shell_Flag_VSIDE) {
        /* In a VS IDE a semicolon is written ";".  If this is written
           in an un-quoted argument it starts a quoted segment,
           inserts the ; and ends the segment.  If it is written in a
           quoted argument it ends quoting, inserts the ; and restarts
           quoting.  Either way the ; is isolated.  */
        out << "\";\"";
      } else {
        /* Otherwise a semicolon is written just ;. */
        out << ';';
      }
    } else {
      /* Store this character.  */
      out << *c;
    }
  }

  if (needQuotes) {
    /* Add enough backslashes to escape any trailing ones.  */
    while (windows_backslashes > 0) {
      --windows_backslashes;
      out << '\\';
    }

    /* Add the closing quote for this argument.  */
    if (flags & Shell_Flag_WatcomQuote) {
      out << '\'';
      if (flags & Shell_Flag_IsUnix) {
        out << '"';
      }
    } else {
      out << '"';
    }
  }

  return out.str();
}